

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifMap.c
# Opt level: O0

void If_ObjPerformMappingAnd(If_Man_t *p,If_Obj_t *pObj,int Mode,int fPreprocess,int fFirst)

{
  short sVar1;
  long lVar2;
  If_DsdMan_t *pIVar3;
  code *pcVar4;
  If_Obj_t *pIVar5;
  char cVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  If_Cut_t *pIVar10;
  abctime aVar11;
  word *pwVar12;
  uchar *pPerm;
  uint *puVar13;
  int *piVar14;
  char *pcVar15;
  uint uVar16;
  ulong uVar17;
  bool bVar18;
  float fVar19;
  float local_1c8;
  float local_1c4;
  float local_1c0;
  uint local_198;
  bool local_191;
  bool local_181;
  bool local_10b;
  float local_108;
  float local_104;
  float local_100;
  bool local_ce;
  bool local_cd;
  int local_cc;
  int local_c8;
  int Cost_1;
  int truthId_2;
  int iCofVar;
  int truthId_1;
  int iDecMask;
  word Truth_1;
  word wStack_a8;
  uint TruthU_1;
  word Truth;
  uint TruthU;
  int truthId;
  abctime clk;
  If_Cut_t *pIStack_88;
  int t_1;
  If_Cut_t *t;
  int Cost;
  int fUseAndCut;
  int fSave0;
  int fChange;
  int iCutDsd;
  int v;
  int k;
  int i;
  int fFunc1R;
  int fFunc0R;
  If_Cut_t *pCut1R;
  If_Cut_t *pCut0R;
  If_Cut_t *pCut;
  If_Cut_t *pCut1;
  If_Cut_t *pCut0;
  If_Set_t *pCutSet;
  int local_20;
  int fFirst_local;
  int fPreprocess_local;
  int Mode_local;
  If_Obj_t *pObj_local;
  If_Man_t *p_local;
  
  local_cd = true;
  if ((((((p->pPars->fDelayOpt == 0) && (local_cd = true, p->pPars->fDelayOptLut == 0)) &&
        (local_cd = true, p->pPars->fDsdBalance == 0)) &&
       ((local_cd = true, p->pPars->fUserRecLib == 0 &&
        (local_cd = true, p->pPars->fUserSesLib == 0)))) &&
      (local_cd = true, p->pPars->fUseDsdTune == 0)) &&
     (((local_cd = true, p->pPars->fUseCofVars == 0 && (local_cd = true, p->pPars->fUseAndVars == 0)
       ) && ((local_cd = true, p->pPars->fUse34Spec == 0 &&
             (local_cd = true, p->pPars->pLutStruct == (char *)0x0)))))) {
    local_cd = p->pPars->pFuncCell2 !=
               (_func_int_If_Man_t_ptr_word_ptr_int_Vec_Str_t_ptr_char_ptr_ptr *)0x0;
  }
  Cost = (int)local_cd;
  local_ce = true;
  if (p->pPars->nAndDelay < 1) {
    local_ce = 0 < p->pPars->nAndArea;
  }
  t._4_4_ = (uint)local_ce;
  pCutSet._4_4_ = fFirst;
  local_20 = fPreprocess;
  fFirst_local = Mode;
  _fPreprocess_local = pObj;
  pObj_local = (If_Obj_t *)p;
  iVar7 = If_ObjIsAnd(pObj->pFanin0);
  if ((iVar7 != 0) && (_fPreprocess_local->pFanin0->pCutSet->nCuts < 1)) {
    __assert_fail("!If_ObjIsAnd(pObj->pFanin0) || pObj->pFanin0->pCutSet->nCuts > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifMap.c"
                  ,0xac,"void If_ObjPerformMappingAnd(If_Man_t *, If_Obj_t *, int, int, int)");
  }
  iVar7 = If_ObjIsAnd(_fPreprocess_local->pFanin1);
  pIVar5 = pObj_local;
  if ((iVar7 != 0) && (_fPreprocess_local->pFanin1->pCutSet->nCuts < 1)) {
    __assert_fail("!If_ObjIsAnd(pObj->pFanin1) || pObj->pFanin1->pCutSet->nCuts > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifMap.c"
                  ,0xad,"void If_ObjPerformMappingAnd(If_Man_t *, If_Obj_t *, int, int, int)");
  }
  if (fFirst_local == 0) {
    _fPreprocess_local->EstRefs = (float)_fPreprocess_local->nRefs;
  }
  else if (fFirst_local == 1) {
    _fPreprocess_local->EstRefs =
         (_fPreprocess_local->EstRefs + _fPreprocess_local->EstRefs +
         (float)_fPreprocess_local->nRefs) / 3.0;
  }
  if ((fFirst_local != 0) && (0 < _fPreprocess_local->nRefs)) {
    pIVar10 = If_ObjCutBest(_fPreprocess_local);
    If_CutAreaDeref((If_Man_t *)pIVar5,pIVar10);
  }
  pCut0 = (If_Cut_t *)If_ManSetupNodeCutSet((If_Man_t *)pObj_local,_fPreprocess_local);
  pCut0R = If_ObjCutBest(_fPreprocess_local);
  if (pCutSet._4_4_ == 0) {
    if (*(int *)(*(long *)&pObj_local->IdPio + 0x54) == 0) {
      if (*(int *)(*(long *)&pObj_local->IdPio + 0x5c) == 0) {
        if (*(int *)(*(long *)&pObj_local->IdPio + 0x60) == 0) {
          if (*(int *)(*(long *)&pObj_local->IdPio + 100) == 0) {
            if (*(int *)(*(long *)&pObj_local->IdPio + 0x58) == 0) {
              if (*(int *)(*(long *)&pObj_local->IdPio + 0x10) < 1) {
                fVar19 = If_CutDelay((If_Man_t *)pObj_local,_fPreprocess_local,pCut0R);
                pCut0R->Delay = fVar19;
              }
              else {
                iVar7 = If_CutDelaySop((If_Man_t *)pObj_local,pCut0R);
                pCut0R->Delay = (float)iVar7;
              }
            }
            else {
              iVar7 = If_CutLutBalanceEval((If_Man_t *)pObj_local,pCut0R);
              pCut0R->Delay = (float)iVar7;
            }
          }
          else {
            t._0_4_ = 0;
            *(uint *)&pCut0R->field_0x1c = *(uint *)&pCut0R->field_0x1c & 0xffffdfff | 0x2000;
            pwVar12 = If_CutTruthW((If_Man_t *)pObj_local,pCut0R);
            iVar7 = If_CutLeaveNum(pCut0R);
            piVar14 = If_CutArrTimeProfile((If_Man_t *)pObj_local,pCut0R);
            pcVar15 = If_CutPerm(pCut0R);
            iVar9 = If_ManCutAigDelay((If_Man_t *)pObj_local,_fPreprocess_local,pCut0R);
            iVar7 = Abc_ExactDelayCost(pwVar12,iVar7,piVar14,pcVar15,(int *)&t,iVar9);
            pCut0R->Delay = (float)iVar7;
            if ((int)t == 1000000000) {
              for (fChange = 0; iVar7 = fChange, iVar9 = If_CutLeaveNum(pCut0R), iVar7 < iVar9;
                  fChange = fChange + 1) {
                pcVar15 = If_CutPerm(pCut0R);
                pcVar15[fChange] = 'x';
              }
              *(uint *)&pCut0R->field_0x1c = *(uint *)&pCut0R->field_0x1c & 0xfffff000 | 0xfff;
              *(uint *)&pCut0R->field_0x1c = *(uint *)&pCut0R->field_0x1c & 0xffffbfff | 0x4000;
            }
          }
        }
        else {
          iVar7 = If_CutDelayRecCost3((If_Man_t *)pObj_local,pCut0R,_fPreprocess_local);
          pCut0R->Delay = (float)iVar7;
        }
      }
      else {
        iVar7 = If_CutDsdBalanceEval((If_Man_t *)pObj_local,pCut0R,(Vec_Int_t *)0x0);
        pCut0R->Delay = (float)iVar7;
      }
    }
    else {
      iVar7 = If_CutSopBalanceEval((If_Man_t *)pObj_local,pCut0R,(Vec_Int_t *)0x0);
      pCut0R->Delay = (float)iVar7;
    }
    if ((pCut0R->Delay == -1.0) && (!NAN(pCut0R->Delay))) {
      __assert_fail("pCut->Delay != -1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifMap.c"
                    ,0xd9,"void If_ObjPerformMappingAnd(If_Man_t *, If_Obj_t *, int, int, int)");
    }
    fVar19 = (pObj_local->CutBest).Power;
    if (fVar19 + fVar19 + _fPreprocess_local->Required < pCut0R->Delay) {
      Abc_Print(1,
                "If_ObjPerformMappingAnd(): Warning! Node with ID %d has delay (%f) exceeding the required times (%f).\n"
                ,(double)pCut0R->Delay,
                (double)(_fPreprocess_local->Required + (pObj_local->CutBest).Power),
                (ulong)(uint)_fPreprocess_local->Id);
    }
    if (fFirst_local == 2) {
      local_100 = If_CutAreaDerefed((If_Man_t *)pObj_local,pCut0R);
    }
    else {
      local_100 = If_CutAreaFlow((If_Man_t *)pObj_local,pCut0R);
    }
    pCut0R->Area = local_100;
    if (*(int *)(*(long *)&pObj_local->IdPio + 0x48) != 0) {
      if (fFirst_local == 2) {
        local_104 = If_CutEdgeDerefed((If_Man_t *)pObj_local,pCut0R);
      }
      else {
        local_104 = If_CutEdgeFlow((If_Man_t *)pObj_local,pCut0R);
      }
      pCut0R->Edge = local_104;
    }
    if (*(int *)(*(long *)&pObj_local->IdPio + 0x4c) != 0) {
      if (fFirst_local == 2) {
        local_108 = If_CutPowerDerefed((If_Man_t *)pObj_local,pCut0R,_fPreprocess_local);
      }
      else {
        local_108 = If_CutPowerFlow((If_Man_t *)pObj_local,pCut0R,_fPreprocess_local);
      }
      pCut0R->Power = local_108;
    }
    if (local_20 == 0) {
      lVar2 = *(long *)&pCut0->iCutFunc;
      sVar1 = *(short *)((long)&pCut0->Area + 2);
      *(short *)((long)&pCut0->Area + 2) = sVar1 + 1;
      If_CutCopy((If_Man_t *)pObj_local,*(If_Cut_t **)(lVar2 + (long)sVar1 * 8),pCut0R);
    }
  }
  v = 0;
  do {
    pIVar5 = pObj_local;
    bVar18 = false;
    if (v < _fPreprocess_local->pFanin0->pCutSet->nCuts) {
      pCut1 = _fPreprocess_local->pFanin0->pCutSet->ppCuts[v];
      bVar18 = pCut1 != (If_Cut_t *)0x0;
    }
    if (!bVar18) {
      if (*(short *)((long)&pCut0->Area + 2) < 1) {
        __assert_fail("pCutSet->nCuts > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifMap.c"
                      ,0x1cc,"void If_ObjPerformMappingAnd(If_Man_t *, If_Obj_t *, int, int, int)");
      }
      if ((local_20 == 0) ||
         (*(float *)(**(long **)&pCut0->iCutFunc + 0xc) <=
          _fPreprocess_local->Required + (pObj_local->CutBest).Power)) {
        pIVar10 = If_ObjCutBest(_fPreprocess_local);
        If_CutCopy((If_Man_t *)pIVar5,pIVar10,(If_Cut_t *)**(undefined8 **)&pCut0->iCutFunc);
        if (((*(int *)(*(long *)&pObj_local->IdPio + 0x60) != 0) ||
            (*(int *)(*(long *)&pObj_local->IdPio + 100) != 0)) &&
           ((pIVar10 = If_ObjCutBest(_fPreprocess_local),
            0xffe < (*(uint *)&pIVar10->field_0x1c & 0xfff) ||
            (pIVar10 = If_ObjCutBest(_fPreprocess_local),
            1e+09 < pIVar10->Delay || pIVar10->Delay == 1e+09)))) {
          __assert_fail("If_ObjCutBest(pObj)->Cost < IF_COST_MAX && If_ObjCutBest(pObj)->Delay < ABC_INFINITY"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifMap.c"
                        ,0x1d4,"void If_ObjPerformMappingAnd(If_Man_t *, If_Obj_t *, int, int, int)"
                       );
        }
      }
      if (((*(uint *)_fPreprocess_local >> 0xc & 1) == 0) &&
         (pIVar10 = If_ObjCutBest(_fPreprocess_local), 1 < *(uint *)&pIVar10->field_0x1c >> 0x18)) {
        lVar2 = *(long *)&pCut0->iCutFunc;
        sVar1 = *(short *)((long)&pCut0->Area + 2);
        *(short *)((long)&pCut0->Area + 2) = sVar1 + 1;
        If_ManSetupCutTriv((If_Man_t *)pObj_local,*(If_Cut_t **)(lVar2 + (long)sVar1 * 8),
                           _fPreprocess_local->Id);
        if (*(short *)&pCut0->Area + 1 < (int)*(short *)((long)&pCut0->Area + 2)) {
          __assert_fail("pCutSet->nCuts <= pCutSet->nCutsMax+1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifMap.c"
                        ,0x1da,"void If_ObjPerformMappingAnd(If_Man_t *, If_Obj_t *, int, int, int)"
                       );
        }
      }
      pIVar5 = pObj_local;
      if ((fFirst_local != 0) && (0 < _fPreprocess_local->nRefs)) {
        pIVar10 = If_ObjCutBest(_fPreprocess_local);
        If_CutAreaRef((If_Man_t *)pIVar5,pIVar10);
      }
      pIVar10 = If_ObjCutBest(_fPreprocess_local);
      if ((*(uint *)&pIVar10->field_0x1c >> 0xe & 1) != 0) {
        Abc_Print(1,"The best cut is useless.\n");
      }
      if (*(long *)(*(long *)&pObj_local->IdPio + 0x128) != 0) {
        v = 0;
        while( true ) {
          bVar18 = false;
          if (v < _fPreprocess_local->pCutSet->nCuts) {
            pCut0R = _fPreprocess_local->pCutSet->ppCuts[v];
            bVar18 = pCut0R != (If_Cut_t *)0x0;
          }
          if (!bVar18) break;
          (**(code **)(*(long *)&pObj_local->IdPio + 0x128))(pObj_local,_fPreprocess_local,pCut0R);
          v = v + 1;
        }
      }
      If_ManDerefNodeCutSet((If_Man_t *)pObj_local,_fPreprocess_local);
      return;
    }
    iCutDsd = 0;
    while( true ) {
      bVar18 = false;
      if (iCutDsd < _fPreprocess_local->pFanin1->pCutSet->nCuts) {
        pCut = _fPreprocess_local->pFanin1->pCutSet->ppCuts[iCutDsd];
        bVar18 = pCut != (If_Cut_t *)0x0;
      }
      if (!bVar18) break;
      if (*(short *)&pCut0->Area < *(short *)((long)&pCut0->Area + 2)) {
        __assert_fail("pCutSet->nCuts <= pCutSet->nCutsMax",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifMap.c"
                      ,0xed,"void If_ObjPerformMappingAnd(If_Man_t *, If_Obj_t *, int, int, int)");
      }
      pCut0R = *(If_Cut_t **)
                (*(long *)&pCut0->iCutFunc + (long)*(short *)((long)&pCut0->Area + 2) * 8);
      iVar7 = If_WordCountOnes(pCut1->uSign | pCut->uSign);
      if (iVar7 <= **(int **)&pObj_local->IdPio) {
        pCut1R = pCut1;
        _fFunc1R = pCut;
        i = pCut1->iCutFunc ^ *(uint *)&pCut1->field_0x1c >> 0xc & 1 ^
            *(uint *)_fPreprocess_local >> 4 & 1;
        uVar8 = pCut->iCutFunc ^ *(uint *)&pCut->field_0x1c >> 0xc & 1 ^
                *(uint *)_fPreprocess_local >> 5 & 1;
        k = uVar8;
        if (((*(int *)(*(long *)&pObj_local->IdPio + 0x9c) != 0) &&
            (*(uint *)&pCut1->field_0x1c >> 0x18 <= *(uint *)&pCut->field_0x1c >> 0x18)) &&
           ((*(uint *)&pCut1->field_0x1c >> 0x18 != *(uint *)&pCut->field_0x1c >> 0x18 ||
            (i <= (int)uVar8)))) {
          pIStack_88 = pCut1;
          pCut1R = pCut;
          _fFunc1R = pCut1;
          clk._4_4_ = i;
          k = i;
          i = uVar8;
        }
        if (*(int *)(*(long *)&pObj_local->IdPio + 0x9c) == 0) {
          iVar7 = If_CutMergeOrdered((If_Man_t *)pObj_local,pCut1,pCut,pCut0R);
        }
        else {
          iVar7 = If_CutMerge((If_Man_t *)pObj_local,pCut1R,_fFunc1R,pCut0R);
        }
        if ((iVar7 != 0) &&
           (((*(uint *)_fPreprocess_local >> 10 & 1) == 0 ||
            (*(uint *)&pCut0R->field_0x1c >> 0x18 != **(uint **)&pObj_local->IdPio)))) {
          pObj_local[1].Id = pObj_local[1].Id + 1;
          *(int *)&pObj_local[6].CutBest.field_0x1c = *(int *)&pObj_local[6].CutBest.field_0x1c + 1;
          if ((*(int *)(*(long *)&pObj_local->IdPio + 0xc4) != 0) ||
             (iVar7 = If_CutFilter((If_Set_t *)pCut0,pCut0R,Cost), iVar7 == 0)) {
            local_10b = false;
            if (((t._4_4_ != 0) && (local_10b = false, *(uint *)&pCut0R->field_0x1c >> 0x18 == 2))
               && (local_10b = false, pCut0R[1].Area == (float)_fPreprocess_local->pFanin0->Id)) {
              local_10b = pCut0R[1].Edge == (float)_fPreprocess_local->pFanin1->Id;
            }
            *(uint *)&pCut0R->field_0x1c =
                 *(uint *)&pCut0R->field_0x1c & 0xffff7fff | (uint)local_10b << 0xf;
            pCut0R->iCutFunc = -1;
            *(uint *)&pCut0R->field_0x1c = *(uint *)&pCut0R->field_0x1c & 0xffffefff;
            if (*(int *)(*(long *)&pObj_local->IdPio + 0xcc) != 0) {
              _TruthU = 0;
              if (*(int *)(*(long *)&pObj_local->IdPio + 0xac) != 0) {
                _TruthU = Abc_Clock();
              }
              if (*(int *)(*(long *)&pObj_local->IdPio + 0x9c) == 0) {
                fUseAndCut = If_CutComputeTruth((If_Man_t *)pObj_local,pCut0R,pCut1,pCut,
                                                *(uint *)_fPreprocess_local >> 4 & 1,
                                                *(uint *)_fPreprocess_local >> 5 & 1);
              }
              else {
                fUseAndCut = If_CutComputeTruthPerm
                                       ((If_Man_t *)pObj_local,pCut0R,pCut1R,_fFunc1R,i,k);
              }
              if (*(int *)(*(long *)&pObj_local->IdPio + 0xac) != 0) {
                aVar11 = Abc_Clock();
                *(abctime *)&pObj_local[0x12].LValue =
                     (aVar11 - _TruthU) + *(long *)&pObj_local[0x12].LValue;
              }
              if ((((*(int *)(*(long *)&pObj_local->IdPio + 0xc4) == 0) && (fUseAndCut != 0)) &&
                  (iVar7 = If_CutFilter((If_Set_t *)pCut0,pCut0R,Cost), iVar7 != 0)) ||
                 (((*(int *)(*(long *)&pObj_local->IdPio + 0x44) != 0 &&
                   (*(uint *)&pCut0R->field_0x1c >> 0x18 == 6)) &&
                  (iVar7 = If_CutCheckTruth6((If_Man_t *)pObj_local,pCut0R), iVar7 == 0))))
              goto LAB_004f67ed;
              if (*(int *)(*(long *)&pObj_local->IdPio + 0x8c) != 0) {
                iVar7 = Abc_Lit2Var(pCut0R->iCutFunc);
                Truth._4_4_ = iVar7;
                iVar9 = Vec_IntSize(*(Vec_Int_t **)
                                     (&pObj_local[0xb].CutBest.Power +
                                     (ulong)(*(uint *)&pCut0R->field_0x1c >> 0x18) * 2));
                if ((iVar9 <= iVar7) ||
                   (iVar7 = Vec_IntEntry(*(Vec_Int_t **)
                                          (&pObj_local[0xb].CutBest.Power +
                                          (ulong)(*(uint *)&pCut0R->field_0x1c >> 0x18) * 2),
                                         Truth._4_4_), iVar7 == -1)) {
                  while (iVar7 = Truth._4_4_,
                        iVar9 = Vec_IntSize(*(Vec_Int_t **)
                                             (&pObj_local[0xb].CutBest.Power +
                                             (ulong)(*(uint *)&pCut0R->field_0x1c >> 0x18) * 2)),
                        iVar9 <= iVar7) {
                    Vec_IntPush(*(Vec_Int_t **)
                                 (&pObj_local[0xb].CutBest.Power +
                                 (ulong)(*(uint *)&pCut0R->field_0x1c >> 0x18) * 2),-1);
                    for (fChange = 0; iVar7 = fChange,
                        iVar9 = Abc_MaxInt(6,*(uint *)&pCut0R->field_0x1c >> 0x18), iVar7 < iVar9;
                        fChange = fChange + 1) {
                      Vec_StrPush(*(Vec_Str_t **)
                                   (&pObj_local[0xc].CutBest.uSign +
                                   (ulong)(*(uint *)&pCut0R->field_0x1c >> 0x18) * 2),'x');
                    }
                  }
                  pIVar3 = *(If_DsdMan_t **)&pObj_local[9].EstRefs;
                  pwVar12 = If_CutTruthWR((If_Man_t *)pObj_local,pCut0R);
                  uVar8 = *(uint *)&pCut0R->field_0x1c;
                  pPerm = (uchar *)If_CutDsdPerm((If_Man_t *)pObj_local,pCut0R);
                  fSave0 = If_DsdManCompute(pIVar3,pwVar12,uVar8 >> 0x18,pPerm,
                                            *(char **)(*(long *)&pObj_local->IdPio + 0xb8));
                  Vec_IntWriteEntry(*(Vec_Int_t **)
                                     (&pObj_local[0xb].CutBest.Power +
                                     (ulong)(*(uint *)&pCut0R->field_0x1c >> 0x18) * 2),Truth._4_4_,
                                    fSave0);
                }
                pIVar3 = *(If_DsdMan_t **)&pObj_local[9].EstRefs;
                iVar7 = If_CutDsdLit((If_Man_t *)pObj_local,pCut0R);
                uVar8 = If_DsdManSuppSize(pIVar3,iVar7);
                if (uVar8 != *(uint *)&pCut0R->field_0x1c >> 0x18) {
                  __assert_fail("If_DsdManSuppSize(p->pIfDsdMan, If_CutDsdLit(p, pCut)) == (int)pCut->nLeaves"
                                ,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifMap.c"
                                ,0x138,
                                "void If_ObjPerformMappingAnd(If_Man_t *, If_Obj_t *, int, int, int)"
                               );
                }
              }
              pIVar5 = pObj_local;
              *(uint *)&pCut0R->field_0x1c = *(uint *)&pCut0R->field_0x1c & 0xffffbfff;
              if ((*(long *)(*(long *)&pObj_local->IdPio + 0x130) == 0) &&
                 (*(long *)(*(long *)&pObj_local->IdPio + 0x138) == 0)) {
                if (*(int *)(*(long *)&pObj_local->IdPio + 0x90) == 0) {
                  if (*(int *)(*(long *)&pObj_local->IdPio + 0x6c) == 0) {
                    if (*(int *)(*(long *)&pObj_local->IdPio + 0x98) != 0) {
                      iCofVar = -1;
                      iVar7 = Abc_Lit2Var(pCut0R->iCutFunc);
                      truthId_2 = iVar7;
                      if (0xd < **(int **)&pObj_local->IdPio) {
                        __assert_fail("p->pPars->nLutSize <= 13",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifMap.c"
                                      ,0x176,
                                      "void If_ObjPerformMappingAnd(If_Man_t *, If_Obj_t *, int, int, int)"
                                     );
                      }
                      iVar9 = Vec_IntSize((Vec_Int_t *)
                                          (&pObj_local[0xf].pFanin0)
                                          [*(uint *)&pCut0R->field_0x1c >> 0x18]);
                      if ((iVar9 <= iVar7) ||
                         (iVar7 = Vec_IntEntry((Vec_Int_t *)
                                               (&pObj_local[0xf].pFanin0)
                                               [*(uint *)&pCut0R->field_0x1c >> 0x18],truthId_2),
                         iVar7 == -1)) {
                        while (iVar7 = truthId_2,
                              iVar9 = Vec_IntSize((Vec_Int_t *)
                                                  (&pObj_local[0xf].pFanin0)
                                                  [*(uint *)&pCut0R->field_0x1c >> 0x18]),
                              iVar9 <= iVar7) {
                          Vec_IntPush((Vec_Int_t *)
                                      (&pObj_local[0xf].pFanin0)
                                      [*(uint *)&pCut0R->field_0x1c >> 0x18],-1);
                        }
                        if ((**(int **)&pObj_local->IdPio / 2 <
                             (int)(*(uint *)&pCut0R->field_0x1c >> 0x18)) &&
                           (uVar8 = *(uint *)&pCut0R->field_0x1c >> 0x18,
                           iVar7 = **(int **)&pObj_local->IdPio / 2, uVar16 = iVar7 * 2,
                           uVar8 == uVar16 ||
                           SBORROW4(uVar8,uVar16) != (int)(uVar8 + iVar7 * -2) < 0)) {
                          pwVar12 = If_CutTruthWR((If_Man_t *)pObj_local,pCut0R);
                          iCofVar = Abc_TtProcessBiDec(pwVar12,*(uint *)&pCut0R->field_0x1c >> 0x18,
                                                       **(int **)&pObj_local->IdPio / 2);
                        }
                        else {
                          iCofVar = 0;
                        }
                        Vec_IntWriteEntry((Vec_Int_t *)
                                          (&pObj_local[0xf].pFanin0)
                                          [*(uint *)&pCut0R->field_0x1c >> 0x18],truthId_2,iCofVar);
                      }
                      iCofVar = Vec_IntEntry((Vec_Int_t *)
                                             (&pObj_local[0xf].pFanin0)
                                             [*(uint *)&pCut0R->field_0x1c >> 0x18],truthId_2);
                      if (iCofVar < 0) {
                        __assert_fail("iDecMask >= 0",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifMap.c"
                                      ,0x182,
                                      "void If_ObjPerformMappingAnd(If_Man_t *, If_Obj_t *, int, int, int)"
                                     );
                      }
                      local_181 = false;
                      if (iCofVar == 0) {
                        local_181 = **(int **)&pObj_local->IdPio / 2 <
                                    (int)(*(uint *)&pCut0R->field_0x1c >> 0x18);
                      }
                      *(uint *)&pCut0R->field_0x1c =
                           *(uint *)&pCut0R->field_0x1c & 0xffffbfff | (uint)local_181 << 0xe;
                      *(uint *)((long)&pObj_local[9].pFanin1 + 4) =
                           (*(uint *)&pCut0R->field_0x1c >> 0xe & 1) +
                           *(int *)((long)&pObj_local[9].pFanin1 + 4);
                      uVar17 = (ulong)(*(uint *)&pCut0R->field_0x1c >> 0x18);
                      *(uint *)(&pObj_local[7].field_0x0 + uVar17 * 4) =
                           (*(uint *)&pCut0R->field_0x1c >> 0xe & 1) +
                           *(int *)(&pObj_local[7].field_0x0 + uVar17 * 4);
                      *(int *)&pObj_local[9].pFanin1 = *(int *)&pObj_local[9].pFanin1 + 1;
                      uVar8 = *(uint *)&pCut0R->field_0x1c >> 0x18;
                      (&pObj_local[8].nVisits)[uVar8] = (&pObj_local[8].nVisits)[uVar8] + 1;
                    }
                    if ((*(int *)(*(long *)&pObj_local->IdPio + 0x94) != 0) &&
                       ((*(int *)(*(long *)&pObj_local->IdPio + 0x98) == 0 ||
                        ((*(uint *)&pCut0R->field_0x1c >> 0xe & 1) != 0)))) {
                      Cost_1 = -1;
                      iVar7 = Abc_Lit2Var(pCut0R->iCutFunc);
                      local_c8 = iVar7;
                      iVar9 = Vec_StrSize(*(Vec_Str_t **)
                                           (&pObj_local[0xe].IdPio +
                                           (ulong)(*(uint *)&pCut0R->field_0x1c >> 0x18) * 2));
                      if ((iVar9 <= iVar7) ||
                         (cVar6 = Vec_StrEntry(*(Vec_Str_t **)
                                                (&pObj_local[0xe].IdPio +
                                                (ulong)(*(uint *)&pCut0R->field_0x1c >> 0x18) * 2),
                                               local_c8), cVar6 == -1)) {
                        while (iVar7 = local_c8,
                              iVar9 = Vec_StrSize(*(Vec_Str_t **)
                                                   (&pObj_local[0xe].IdPio +
                                                   (ulong)(*(uint *)&pCut0R->field_0x1c >> 0x18) * 2
                                                   )), iVar9 <= iVar7) {
                          Vec_StrPush(*(Vec_Str_t **)
                                       (&pObj_local[0xe].IdPio +
                                       (ulong)(*(uint *)&pCut0R->field_0x1c >> 0x18) * 2),-1);
                        }
                        pwVar12 = If_CutTruthWR((If_Man_t *)pObj_local,pCut0R);
                        Cost_1 = Abc_TtCheckCondDep(pwVar12,*(uint *)&pCut0R->field_0x1c >> 0x18,
                                                    **(int **)&pObj_local->IdPio / 2);
                        Vec_StrWriteEntry(*(Vec_Str_t **)
                                           (&pObj_local[0xe].IdPio +
                                           (ulong)(*(uint *)&pCut0R->field_0x1c >> 0x18) * 2),
                                          local_c8,(char)Cost_1);
                      }
                      cVar6 = Vec_StrEntry(*(Vec_Str_t **)
                                            (&pObj_local[0xe].IdPio +
                                            (ulong)(*(uint *)&pCut0R->field_0x1c >> 0x18) * 2),
                                           local_c8);
                      Cost_1 = (int)cVar6;
                      if ((Cost_1 < 0) || ((int)(*(uint *)&pCut0R->field_0x1c >> 0x18) < Cost_1)) {
                        __assert_fail("iCofVar >= 0 && iCofVar <= (int)pCut->nLeaves",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifMap.c"
                                      ,0x194,
                                      "void If_ObjPerformMappingAnd(If_Man_t *, If_Obj_t *, int, int, int)"
                                     );
                      }
                      local_191 = false;
                      if (Cost_1 == *(uint *)&pCut0R->field_0x1c >> 0x18) {
                        local_191 = *(uint *)&pCut0R->field_0x1c >> 0x18 != 0;
                      }
                      *(uint *)&pCut0R->field_0x1c =
                           *(uint *)&pCut0R->field_0x1c & 0xffffbfff | (uint)local_191 << 0xe;
                      *(uint *)((long)&pObj_local[9].pFanin1 + 4) =
                           (*(uint *)&pCut0R->field_0x1c >> 0xe & 1) +
                           *(int *)((long)&pObj_local[9].pFanin1 + 4);
                      uVar17 = (ulong)(*(uint *)&pCut0R->field_0x1c >> 0x18);
                      *(uint *)(&pObj_local[7].field_0x0 + uVar17 * 4) =
                           (*(uint *)&pCut0R->field_0x1c >> 0xe & 1) +
                           *(int *)(&pObj_local[7].field_0x0 + uVar17 * 4);
                      *(int *)&pObj_local[9].pFanin1 = *(int *)&pObj_local[9].pFanin1 + 1;
                      uVar8 = *(uint *)&pCut0R->field_0x1c >> 0x18;
                      (&pObj_local[8].nVisits)[uVar8] = (&pObj_local[8].nVisits)[uVar8] + 1;
                    }
                  }
                  else {
                    if (4 < *(uint *)&pCut0R->field_0x1c >> 0x18) {
                      __assert_fail("pCut->nLeaves <= 4",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifMap.c"
                                    ,0x16d,
                                    "void If_ObjPerformMappingAnd(If_Man_t *, If_Obj_t *, int, int, int)"
                                   );
                    }
                    if (*(uint *)&pCut0R->field_0x1c >> 0x18 == 4) {
                      puVar13 = If_CutTruth((If_Man_t *)pObj_local,pCut0R);
                      iVar7 = Abc_Tt4Check(*puVar13 & 0xffff);
                      if (iVar7 == 0) {
                        *(uint *)&pCut0R->field_0x1c =
                             *(uint *)&pCut0R->field_0x1c & 0xffffbfff | 0x4000;
                      }
                    }
                  }
                }
                else {
                  pIVar3 = *(If_DsdMan_t **)&pObj_local[9].EstRefs;
                  iVar7 = If_CutDsdLit((If_Man_t *)pObj_local,pCut0R);
                  uVar8 = If_DsdManReadMark(pIVar3,iVar7);
                  *(uint *)&pCut0R->field_0x1c =
                       *(uint *)&pCut0R->field_0x1c & 0xffffbfff | (uVar8 & 1) << 0xe;
                  *(uint *)((long)&pObj_local[9].pFanin1 + 4) =
                       (*(uint *)&pCut0R->field_0x1c >> 0xe & 1) +
                       *(int *)((long)&pObj_local[9].pFanin1 + 4);
                  uVar17 = (ulong)(*(uint *)&pCut0R->field_0x1c >> 0x18);
                  *(uint *)(&pObj_local[7].field_0x0 + uVar17 * 4) =
                       (*(uint *)&pCut0R->field_0x1c >> 0xe & 1) +
                       *(int *)(&pObj_local[7].field_0x0 + uVar17 * 4);
                  *(int *)&pObj_local[9].pFanin1 = *(int *)&pObj_local[9].pFanin1 + 1;
                  uVar8 = *(uint *)&pCut0R->field_0x1c >> 0x18;
                  (&pObj_local[8].nVisits)[uVar8] = (&pObj_local[8].nVisits)[uVar8] + 1;
                }
              }
              else {
                if (*(int *)(*(long *)&pObj_local->IdPio + 0x9c) != 0) {
                  __assert_fail("p->pPars->fUseTtPerm == 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifMap.c"
                                ,0x13f,
                                "void If_ObjPerformMappingAnd(If_Man_t *, If_Obj_t *, int, int, int)"
                               );
                }
                if (((*(uint *)&pCut0R->field_0x1c >> 0x10 & 0xff) < 4) ||
                   (0x10 < (*(uint *)&pCut0R->field_0x1c >> 0x10 & 0xff))) {
                  __assert_fail("pCut->nLimit >= 4 && pCut->nLimit <= 16",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifMap.c"
                                ,0x140,
                                "void If_ObjPerformMappingAnd(If_Man_t *, If_Obj_t *, int, int, int)"
                               );
                }
                if (*(int *)(*(long *)&pObj_local->IdPio + 0x8c) == 0) {
                  if (*(long *)(*(long *)&pObj_local->IdPio + 0x138) == 0) {
                    pcVar4 = *(code **)(*(long *)&pObj_local->IdPio + 0x130);
                    puVar13 = If_CutTruth((If_Man_t *)pObj_local,pCut0R);
                    iVar7 = Abc_MaxInt(6,*(uint *)&pCut0R->field_0x1c >> 0x18);
                    iVar7 = (*pcVar4)(pIVar5,puVar13,iVar7,*(uint *)&pCut0R->field_0x1c >> 0x18,
                                      *(undefined8 *)(*(long *)&pObj_local->IdPio + 0xb8));
                    *(uint *)&pCut0R->field_0x1c =
                         *(uint *)&pCut0R->field_0x1c & 0xffffbfff | (uint)(iVar7 == 0) << 0xe;
                  }
                  else {
                    pcVar4 = *(code **)(*(long *)&pObj_local->IdPio + 0x138);
                    pwVar12 = If_CutTruthW((If_Man_t *)pObj_local,pCut0R);
                    iVar7 = (*pcVar4)(pIVar5,pwVar12,*(uint *)&pCut0R->field_0x1c >> 0x18,0);
                    *(uint *)&pCut0R->field_0x1c =
                         *(uint *)&pCut0R->field_0x1c & 0xffffbfff | (uint)(iVar7 == 0) << 0xe;
                  }
                }
                else {
                  pIVar3 = *(If_DsdMan_t **)&pObj_local[9].EstRefs;
                  iVar7 = If_CutDsdLit((If_Man_t *)pObj_local,pCut0R);
                  uVar8 = If_DsdManCheckDec(pIVar3,iVar7);
                  *(uint *)&pCut0R->field_0x1c =
                       *(uint *)&pCut0R->field_0x1c & 0xffffbfff | (uVar8 & 1) << 0xe;
                }
                *(uint *)((long)&pObj_local[9].pFanin1 + 4) =
                     (*(uint *)&pCut0R->field_0x1c >> 0xe & 1) +
                     *(int *)((long)&pObj_local[9].pFanin1 + 4);
                uVar17 = (ulong)(*(uint *)&pCut0R->field_0x1c >> 0x18);
                *(uint *)(&pObj_local[7].field_0x0 + uVar17 * 4) =
                     (*(uint *)&pCut0R->field_0x1c >> 0xe & 1) +
                     *(int *)(&pObj_local[7].field_0x0 + uVar17 * 4);
                *(int *)&pObj_local[9].pFanin1 = *(int *)&pObj_local[9].pFanin1 + 1;
                uVar8 = *(uint *)&pCut0R->field_0x1c >> 0x18;
                (&pObj_local[8].nVisits)[uVar8] = (&pObj_local[8].nVisits)[uVar8] + 1;
                if ((((*(int *)(*(long *)&pObj_local->IdPio + 0x84) == 0) &&
                     (*(int *)(*(long *)&pObj_local->IdPio + 0x88) == 0)) ||
                    (*(uint *)&pCut0R->field_0x1c >> 0x18 != 5)) ||
                   ((*(uint *)&pCut0R->field_0x1c >> 0x10 & 0xff) != 5)) {
                  if ((*(int *)(*(long *)&pObj_local->IdPio + 0xac) != 0) &&
                     (*(uint *)&pCut0R->field_0x1c >> 0x18 == 5)) {
                    puVar13 = If_CutTruth((If_Man_t *)pObj_local,pCut0R);
                    Truth_1._4_4_ = *puVar13;
                    _truthId_1 = CONCAT44(Truth_1._4_4_,Truth_1._4_4_);
                    *(int *)&pObj_local[9].pEquiv = *(int *)&pObj_local[9].pEquiv + 1;
                    iVar7 = If_CluCheckDecInAny(_truthId_1,5);
                    if ((iVar7 != 0) || (iVar7 = If_CluCheckDecOut(_truthId_1,5), iVar7 != 0)) {
                      *(int *)((long)&pObj_local[9].pEquiv + 4) =
                           *(int *)((long)&pObj_local[9].pEquiv + 4) + 1;
                    }
                  }
                }
                else {
                  puVar13 = If_CutTruth((If_Man_t *)pObj_local,pCut0R);
                  Truth._0_4_ = *puVar13;
                  wStack_a8 = CONCAT44((uint)Truth,(uint)Truth);
                  *(int *)&pObj_local[9].pEquiv = *(int *)&pObj_local[9].pEquiv + 1;
                  iVar7 = If_CluCheckDecInAny(wStack_a8,5);
                  if (iVar7 == 0) goto LAB_004f67ed;
                  *(int *)((long)&pObj_local[9].pEquiv + 4) =
                       *(int *)((long)&pObj_local[9].pEquiv + 4) + 1;
                }
              }
            }
            *(uint *)&pCut0R->field_0x1c =
                 *(uint *)&pCut0R->field_0x1c & 0xffffdfff |
                 (uint)(*(long *)(*(long *)&pObj_local->IdPio + 0x120) != 0) << 0xd;
            if (*(long *)(*(long *)&pObj_local->IdPio + 0x120) == 0) {
              local_198 = 0;
            }
            else {
              local_198 = (**(code **)(*(long *)&pObj_local->IdPio + 0x120))(pObj_local,pCut0R);
            }
            *(uint *)&pCut0R->field_0x1c =
                 *(uint *)&pCut0R->field_0x1c & 0xfffff000 | local_198 & 0xfff;
            if ((*(uint *)&pCut0R->field_0x1c & 0xfff) != 0xfff) {
              if (*(int *)(*(long *)&pObj_local->IdPio + 0x54) == 0) {
                if (*(int *)(*(long *)&pObj_local->IdPio + 0x5c) == 0) {
                  if (*(int *)(*(long *)&pObj_local->IdPio + 0x60) == 0) {
                    if (*(int *)(*(long *)&pObj_local->IdPio + 100) == 0) {
                      if (*(int *)(*(long *)&pObj_local->IdPio + 0x58) == 0) {
                        if (*(int *)(*(long *)&pObj_local->IdPio + 0x10) < 1) {
                          fVar19 = If_CutDelay((If_Man_t *)pObj_local,_fPreprocess_local,pCut0R);
                          pCut0R->Delay = fVar19;
                        }
                        else {
                          iVar7 = If_CutDelaySop((If_Man_t *)pObj_local,pCut0R);
                          pCut0R->Delay = (float)iVar7;
                        }
                      }
                      else {
                        iVar7 = If_CutLutBalanceEval((If_Man_t *)pObj_local,pCut0R);
                        pCut0R->Delay = (float)iVar7;
                      }
                    }
                    else {
                      local_cc = 0;
                      *(uint *)&pCut0R->field_0x1c =
                           *(uint *)&pCut0R->field_0x1c & 0xffffdfff | 0x2000;
                      pwVar12 = If_CutTruthW((If_Man_t *)pObj_local,pCut0R);
                      iVar7 = If_CutLeaveNum(pCut0R);
                      piVar14 = If_CutArrTimeProfile((If_Man_t *)pObj_local,pCut0R);
                      pcVar15 = If_CutPerm(pCut0R);
                      iVar9 = If_ManCutAigDelay((If_Man_t *)pObj_local,_fPreprocess_local,pCut0R);
                      iVar7 = Abc_ExactDelayCost(pwVar12,iVar7,piVar14,pcVar15,&local_cc,iVar9);
                      pCut0R->Delay = (float)iVar7;
                      if (local_cc == 1000000000) {
                        for (fChange = 0; iVar7 = fChange, iVar9 = If_CutLeaveNum(pCut0R),
                            iVar7 < iVar9; fChange = fChange + 1) {
                          pcVar15 = If_CutPerm(pCut0R);
                          pcVar15[fChange] = 'x';
                        }
                        *(uint *)&pCut0R->field_0x1c =
                             *(uint *)&pCut0R->field_0x1c & 0xfffff000 | 0xfff;
                        *(uint *)&pCut0R->field_0x1c =
                             *(uint *)&pCut0R->field_0x1c & 0xffffbfff | 0x4000;
                      }
                    }
                  }
                  else {
                    iVar7 = If_CutDelayRecCost3((If_Man_t *)pObj_local,pCut0R,_fPreprocess_local);
                    pCut0R->Delay = (float)iVar7;
                  }
                }
                else {
                  iVar7 = If_CutDsdBalanceEval((If_Man_t *)pObj_local,pCut0R,(Vec_Int_t *)0x0);
                  pCut0R->Delay = (float)iVar7;
                }
              }
              else {
                iVar7 = If_CutSopBalanceEval((If_Man_t *)pObj_local,pCut0R,(Vec_Int_t *)0x0);
                pCut0R->Delay = (float)iVar7;
              }
              if (((pCut0R->Delay != -1.0) || (NAN(pCut0R->Delay))) &&
                 ((fFirst_local == 0 ||
                  (pCut0R->Delay <= _fPreprocess_local->Required + (pObj_local->CutBest).Power)))) {
                if (fFirst_local == 2) {
                  local_1c0 = If_CutAreaDerefed((If_Man_t *)pObj_local,pCut0R);
                }
                else {
                  local_1c0 = If_CutAreaFlow((If_Man_t *)pObj_local,pCut0R);
                }
                pCut0R->Area = local_1c0;
                if (*(int *)(*(long *)&pObj_local->IdPio + 0x48) != 0) {
                  if (fFirst_local == 2) {
                    local_1c4 = If_CutEdgeDerefed((If_Man_t *)pObj_local,pCut0R);
                  }
                  else {
                    local_1c4 = If_CutEdgeFlow((If_Man_t *)pObj_local,pCut0R);
                  }
                  pCut0R->Edge = local_1c4;
                }
                if (*(int *)(*(long *)&pObj_local->IdPio + 0x4c) != 0) {
                  if (fFirst_local == 2) {
                    local_1c8 = If_CutPowerDerefed((If_Man_t *)pObj_local,pCut0R,_fPreprocess_local)
                    ;
                  }
                  else {
                    local_1c8 = If_CutPowerFlow((If_Man_t *)pObj_local,pCut0R,_fPreprocess_local);
                  }
                  pCut0R->Power = local_1c8;
                }
                If_CutSort((If_Man_t *)pObj_local,(If_Set_t *)pCut0,pCut0R);
              }
            }
          }
        }
      }
LAB_004f67ed:
      iCutDsd = iCutDsd + 1;
    }
    v = v + 1;
  } while( true );
}

Assistant:

void If_ObjPerformMappingAnd( If_Man_t * p, If_Obj_t * pObj, int Mode, int fPreprocess, int fFirst )
{
    If_Set_t * pCutSet;
    If_Cut_t * pCut0, * pCut1, * pCut;
    If_Cut_t * pCut0R, * pCut1R;
    int fFunc0R, fFunc1R;
    int i, k, v, iCutDsd, fChange;
    int fSave0 = p->pPars->fDelayOpt || p->pPars->fDelayOptLut || p->pPars->fDsdBalance || p->pPars->fUserRecLib || p->pPars->fUserSesLib || 
        p->pPars->fUseDsdTune || p->pPars->fUseCofVars || p->pPars->fUseAndVars || p->pPars->fUse34Spec || p->pPars->pLutStruct || p->pPars->pFuncCell2;
    int fUseAndCut = (p->pPars->nAndDelay > 0) || (p->pPars->nAndArea > 0);
    assert( !If_ObjIsAnd(pObj->pFanin0) || pObj->pFanin0->pCutSet->nCuts > 0 );
    assert( !If_ObjIsAnd(pObj->pFanin1) || pObj->pFanin1->pCutSet->nCuts > 0 );

    // prepare
    if ( Mode == 0 )
        pObj->EstRefs = (float)pObj->nRefs;
    else if ( Mode == 1 )
        pObj->EstRefs = (float)((2.0 * pObj->EstRefs + pObj->nRefs) / 3.0);
    // deref the selected cut
    if ( Mode && pObj->nRefs > 0 )
        If_CutAreaDeref( p, If_ObjCutBest(pObj) );

    // prepare the cutset
    pCutSet = If_ManSetupNodeCutSet( p, pObj );

    // get the current assigned best cut
    pCut = If_ObjCutBest(pObj);
    if ( !fFirst )
    {
        // recompute the parameters of the best cut
        if ( p->pPars->fDelayOpt )
            pCut->Delay = If_CutSopBalanceEval( p, pCut, NULL );
        else if ( p->pPars->fDsdBalance )
            pCut->Delay = If_CutDsdBalanceEval( p, pCut, NULL );
        else if ( p->pPars->fUserRecLib )
            pCut->Delay = If_CutDelayRecCost3( p, pCut, pObj ); 
        else if ( p->pPars->fUserSesLib )
        {
            int Cost = 0;
            pCut->fUser = 1;
            pCut->Delay = (float)Abc_ExactDelayCost( If_CutTruthW(p, pCut), If_CutLeaveNum(pCut), If_CutArrTimeProfile(p, pCut), If_CutPerm(pCut), &Cost, If_ManCutAigDelay(p, pObj, pCut) ); 
            if ( Cost == ABC_INFINITY )
            {
                for ( v = 0; v < If_CutLeaveNum(pCut); v++ )
                    If_CutPerm(pCut)[v] = IF_BIG_CHAR;
                pCut->Cost = IF_COST_MAX;
                pCut->fUseless = 1;
            }
        }
        else if ( p->pPars->fDelayOptLut )
            pCut->Delay = If_CutLutBalanceEval( p, pCut );
        else if( p->pPars->nGateSize > 0 )
            pCut->Delay = If_CutDelaySop( p, pCut );
        else
            pCut->Delay = If_CutDelay( p, pObj, pCut );
        assert( pCut->Delay != -1 );
//        assert( pCut->Delay <= pObj->Required + p->fEpsilon );
        if ( pCut->Delay > pObj->Required + 2*p->fEpsilon )
            Abc_Print( 1, "If_ObjPerformMappingAnd(): Warning! Node with ID %d has delay (%f) exceeding the required times (%f).\n", 
                pObj->Id, pCut->Delay, pObj->Required + p->fEpsilon );
        pCut->Area = (Mode == 2)? If_CutAreaDerefed( p, pCut ) : If_CutAreaFlow( p, pCut );
        if ( p->pPars->fEdge )
            pCut->Edge = (Mode == 2)? If_CutEdgeDerefed( p, pCut ) : If_CutEdgeFlow( p, pCut );
        if ( p->pPars->fPower )
            pCut->Power = (Mode == 2)? If_CutPowerDerefed( p, pCut, pObj ) : If_CutPowerFlow( p, pCut, pObj );
        // save the best cut from the previous iteration
        if ( !fPreprocess )
            If_CutCopy( p, pCutSet->ppCuts[pCutSet->nCuts++], pCut );
    }

    // generate cuts
    If_ObjForEachCut( pObj->pFanin0, pCut0, i )
    If_ObjForEachCut( pObj->pFanin1, pCut1, k )
    {
        // get the next free cut
        assert( pCutSet->nCuts <= pCutSet->nCutsMax );
        pCut = pCutSet->ppCuts[pCutSet->nCuts];
        // make sure K-feasible cut exists
        if ( If_WordCountOnes(pCut0->uSign | pCut1->uSign) > p->pPars->nLutSize )
            continue;

        pCut0R = pCut0;
        pCut1R = pCut1;
        fFunc0R = pCut0->iCutFunc ^ pCut0->fCompl ^ pObj->fCompl0;
        fFunc1R = pCut1->iCutFunc ^ pCut1->fCompl ^ pObj->fCompl1;
        if ( !p->pPars->fUseTtPerm || pCut0->nLeaves > pCut1->nLeaves || (pCut0->nLeaves == pCut1->nLeaves && fFunc0R > fFunc1R) )
        {
        }
        else
        {
            ABC_SWAP( If_Cut_t *, pCut0R, pCut1R );
            ABC_SWAP( int, fFunc0R, fFunc1R );
        }        

        // merge the cuts
        if ( p->pPars->fUseTtPerm )
        {
            if ( !If_CutMerge( p, pCut0R, pCut1R, pCut ) )
                continue;
        }
        else
        {
            if ( !If_CutMergeOrdered( p, pCut0, pCut1, pCut ) )
                continue;
        }
        if ( pObj->fSpec && pCut->nLeaves == (unsigned)p->pPars->nLutSize )
            continue;
        p->nCutsMerged++;
        p->nCutsTotal++;
        // check if this cut is contained in any of the available cuts
        if ( !p->pPars->fSkipCutFilter && If_CutFilter( pCutSet, pCut, fSave0 ) )
            continue;
        // check if the cut is a special AND-gate cut
        pCut->fAndCut = fUseAndCut && pCut->nLeaves == 2 && pCut->pLeaves[0] == pObj->pFanin0->Id && pCut->pLeaves[1] == pObj->pFanin1->Id;
        //assert( pCut->nLeaves != 2 || pCut->pLeaves[0] < pCut->pLeaves[1] );
        //assert( pCut->nLeaves != 2 || pObj->pFanin0->Id < pObj->pFanin1->Id );
        // compute the truth table
        pCut->iCutFunc = -1;
        pCut->fCompl = 0;
        if ( p->pPars->fTruth )
        {
//            int nShared = pCut0->nLeaves + pCut1->nLeaves - pCut->nLeaves;
            abctime clk = 0;
            if ( p->pPars->fVerbose )
                clk = Abc_Clock();
            if ( p->pPars->fUseTtPerm )
                fChange = If_CutComputeTruthPerm( p, pCut, pCut0R, pCut1R, fFunc0R, fFunc1R );
            else
                fChange = If_CutComputeTruth( p, pCut, pCut0, pCut1, pObj->fCompl0, pObj->fCompl1 );
            if ( p->pPars->fVerbose )
                p->timeCache[4] += Abc_Clock() - clk;
            if ( !p->pPars->fSkipCutFilter && fChange && If_CutFilter( pCutSet, pCut, fSave0 ) )
                continue;
            if ( p->pPars->fLut6Filter && pCut->nLeaves == 6 && !If_CutCheckTruth6(p, pCut) )
                continue;
            if ( p->pPars->fUseDsd )
            {
                extern void If_ManCacheRecord( If_Man_t * p, int iDsd0, int iDsd1, int nShared, int iDsd );
                int truthId = Abc_Lit2Var(pCut->iCutFunc);
                if ( truthId >= Vec_IntSize(p->vTtDsds[pCut->nLeaves]) || Vec_IntEntry(p->vTtDsds[pCut->nLeaves], truthId) == -1 )
                {
                    while ( truthId >= Vec_IntSize(p->vTtDsds[pCut->nLeaves]) )
                    {
                        Vec_IntPush( p->vTtDsds[pCut->nLeaves], -1 );
                        for ( v = 0; v < Abc_MaxInt(6, pCut->nLeaves); v++ )
                            Vec_StrPush( p->vTtPerms[pCut->nLeaves], IF_BIG_CHAR );
                    }
                    iCutDsd = If_DsdManCompute( p->pIfDsdMan, If_CutTruthWR(p, pCut), pCut->nLeaves, (unsigned char *)If_CutDsdPerm(p, pCut), p->pPars->pLutStruct );
                    Vec_IntWriteEntry( p->vTtDsds[pCut->nLeaves], truthId, iCutDsd );
                }
                assert( If_DsdManSuppSize(p->pIfDsdMan, If_CutDsdLit(p, pCut)) == (int)pCut->nLeaves );
                //If_ManCacheRecord( p, If_CutDsdLit(p, pCut0), If_CutDsdLit(p, pCut1), nShared, If_CutDsdLit(p, pCut) );
            }
            // run user functions
            pCut->fUseless = 0;
            if ( p->pPars->pFuncCell || p->pPars->pFuncCell2 )
            {
                assert( p->pPars->fUseTtPerm == 0 );
                assert( pCut->nLimit >= 4 && pCut->nLimit <= 16 );
                if ( p->pPars->fUseDsd )
                    pCut->fUseless = If_DsdManCheckDec( p->pIfDsdMan, If_CutDsdLit(p, pCut) );
                else if ( p->pPars->pFuncCell2 )
                    pCut->fUseless = !p->pPars->pFuncCell2( p, (word *)If_CutTruthW(p, pCut), pCut->nLeaves, NULL, NULL );
                else
                    pCut->fUseless = !p->pPars->pFuncCell( p, If_CutTruth(p, pCut), Abc_MaxInt(6, pCut->nLeaves), pCut->nLeaves, p->pPars->pLutStruct );
                p->nCutsUselessAll += pCut->fUseless;
                p->nCutsUseless[pCut->nLeaves] += pCut->fUseless;
                p->nCutsCountAll++;
                p->nCutsCount[pCut->nLeaves]++;
                // skip 5-input cuts, which cannot be decomposed
                if ( (p->pPars->fEnableCheck75 || p->pPars->fEnableCheck75u) && pCut->nLeaves == 5 && pCut->nLimit == 5 )
                {
                    extern int If_CluCheckDecInAny( word t, int nVars );
                    extern int If_CluCheckDecOut( word t, int nVars );
                    unsigned TruthU = *If_CutTruth(p, pCut);
                    word Truth = (((word)TruthU << 32) | (word)TruthU);
                    p->nCuts5++;
                    if ( If_CluCheckDecInAny( Truth, 5 ) )
                        p->nCuts5a++;
                    else
                        continue;
                }
                else if ( p->pPars->fVerbose && pCut->nLeaves == 5 )
                {
                    extern int If_CluCheckDecInAny( word t, int nVars );
                    extern int If_CluCheckDecOut( word t, int nVars );
                    unsigned TruthU = *If_CutTruth(p, pCut);
                    word Truth = (((word)TruthU << 32) | (word)TruthU);
                    p->nCuts5++;
                    if ( If_CluCheckDecInAny( Truth, 5 ) || If_CluCheckDecOut( Truth, 5 ) )
                        p->nCuts5a++;
                }
            }
            else if ( p->pPars->fUseDsdTune )
            {
                pCut->fUseless = If_DsdManReadMark( p->pIfDsdMan, If_CutDsdLit(p, pCut) );
                p->nCutsUselessAll += pCut->fUseless;
                p->nCutsUseless[pCut->nLeaves] += pCut->fUseless;
                p->nCutsCountAll++;
                p->nCutsCount[pCut->nLeaves]++;
            }
            else if ( p->pPars->fUse34Spec )
            {
                assert( pCut->nLeaves <= 4 );
                if ( pCut->nLeaves == 4 && !Abc_Tt4Check( (int)(0xFFFF & *If_CutTruth(p, pCut)) ) )
                    pCut->fUseless = 1;
            }
            else 
            {
                if ( p->pPars->fUseAndVars )
                {
                    int iDecMask = -1, truthId = Abc_Lit2Var(pCut->iCutFunc);
                    assert( p->pPars->nLutSize <= 13 );
                    if ( truthId >= Vec_IntSize(p->vTtDecs[pCut->nLeaves]) || Vec_IntEntry(p->vTtDecs[pCut->nLeaves], truthId) == -1 )
                    {
                        while ( truthId >= Vec_IntSize(p->vTtDecs[pCut->nLeaves]) )
                            Vec_IntPush( p->vTtDecs[pCut->nLeaves], -1 );
                        if ( (int)pCut->nLeaves > p->pPars->nLutSize / 2 && (int)pCut->nLeaves <= 2 * (p->pPars->nLutSize / 2) )
                            iDecMask = Abc_TtProcessBiDec( If_CutTruthWR(p, pCut), (int)pCut->nLeaves, p->pPars->nLutSize / 2 );
                        else
                            iDecMask = 0;
                        Vec_IntWriteEntry( p->vTtDecs[pCut->nLeaves], truthId, iDecMask );
                    }
                    iDecMask = Vec_IntEntry(p->vTtDecs[pCut->nLeaves], truthId);
                    assert( iDecMask >= 0 );
                    pCut->fUseless = (int)(iDecMask == 0 && (int)pCut->nLeaves > p->pPars->nLutSize / 2);
                    p->nCutsUselessAll += pCut->fUseless;
                    p->nCutsUseless[pCut->nLeaves] += pCut->fUseless;
                    p->nCutsCountAll++;
                    p->nCutsCount[pCut->nLeaves]++;
                }
                if ( p->pPars->fUseCofVars && (!p->pPars->fUseAndVars || pCut->fUseless) )
                {
                    int iCofVar = -1, truthId = Abc_Lit2Var(pCut->iCutFunc);
                    if ( truthId >= Vec_StrSize(p->vTtVars[pCut->nLeaves]) || Vec_StrEntry(p->vTtVars[pCut->nLeaves], truthId) == (char)-1 )
                    {
                        while ( truthId >= Vec_StrSize(p->vTtVars[pCut->nLeaves]) )
                            Vec_StrPush( p->vTtVars[pCut->nLeaves], (char)-1 );
                        iCofVar = Abc_TtCheckCondDep( If_CutTruthWR(p, pCut), pCut->nLeaves, p->pPars->nLutSize / 2 );
                        Vec_StrWriteEntry( p->vTtVars[pCut->nLeaves], truthId, (char)iCofVar );
                    }
                    iCofVar = Vec_StrEntry(p->vTtVars[pCut->nLeaves], truthId);
                    assert( iCofVar >= 0 && iCofVar <= (int)pCut->nLeaves );
                    pCut->fUseless = (int)(iCofVar == (int)pCut->nLeaves && pCut->nLeaves > 0);
                    p->nCutsUselessAll += pCut->fUseless;
                    p->nCutsUseless[pCut->nLeaves] += pCut->fUseless;
                    p->nCutsCountAll++;
                    p->nCutsCount[pCut->nLeaves]++;
                }
            }
        }
        
        // compute the application-specific cost and depth
        pCut->fUser = (p->pPars->pFuncCost != NULL);
        pCut->Cost = p->pPars->pFuncCost? p->pPars->pFuncCost(p, pCut) : 0;
        if ( pCut->Cost == IF_COST_MAX )
            continue;
        // check if the cut satisfies the required times
        if ( p->pPars->fDelayOpt )
            pCut->Delay = If_CutSopBalanceEval( p, pCut, NULL );
        else if ( p->pPars->fDsdBalance )
            pCut->Delay = If_CutDsdBalanceEval( p, pCut, NULL );
        else if ( p->pPars->fUserRecLib )
            pCut->Delay = If_CutDelayRecCost3( p, pCut, pObj ); 
        else if ( p->pPars->fUserSesLib )
        {
            int Cost = 0;
            pCut->fUser = 1;
            pCut->Delay = (float)Abc_ExactDelayCost( If_CutTruthW(p, pCut), If_CutLeaveNum(pCut), If_CutArrTimeProfile(p, pCut), If_CutPerm(pCut), &Cost, If_ManCutAigDelay(p, pObj, pCut) ); 
            if ( Cost == ABC_INFINITY )
            {
                for ( v = 0; v < If_CutLeaveNum(pCut); v++ )
                    If_CutPerm(pCut)[v] = IF_BIG_CHAR;
                pCut->Cost = IF_COST_MAX;
                pCut->fUseless = 1;
            }
        }
        else if ( p->pPars->fDelayOptLut )
            pCut->Delay = If_CutLutBalanceEval( p, pCut );
        else if( p->pPars->nGateSize > 0 )
            pCut->Delay = If_CutDelaySop( p, pCut );
        else 
            pCut->Delay = If_CutDelay( p, pObj, pCut );
        if ( pCut->Delay == -1 )
            continue;
        if ( Mode && pCut->Delay > pObj->Required + p->fEpsilon )
            continue;
        // compute area of the cut (this area may depend on the application specific cost)
        pCut->Area = (Mode == 2)? If_CutAreaDerefed( p, pCut ) : If_CutAreaFlow( p, pCut );
        if ( p->pPars->fEdge )
            pCut->Edge = (Mode == 2)? If_CutEdgeDerefed( p, pCut ) : If_CutEdgeFlow( p, pCut );
        if ( p->pPars->fPower )
            pCut->Power = (Mode == 2)? If_CutPowerDerefed( p, pCut, pObj ) : If_CutPowerFlow( p, pCut, pObj );
//        pCut->AveRefs = (Mode == 0)? (float)0.0 : If_CutAverageRefs( p, pCut );
        // insert the cut into storage
        If_CutSort( p, pCutSet, pCut );
//        If_CutTraverse( p, pObj, pCut );
    } 
    assert( pCutSet->nCuts > 0 );
//    If_CutVerifyCuts( pCutSet, !p->pPars->fUseTtPerm );

    // update the best cut
    if ( !fPreprocess || pCutSet->ppCuts[0]->Delay <= pObj->Required + p->fEpsilon )
    {
        If_CutCopy( p, If_ObjCutBest(pObj), pCutSet->ppCuts[0] );
        if ( p->pPars->fUserRecLib || p->pPars->fUserSesLib )
            assert(If_ObjCutBest(pObj)->Cost < IF_COST_MAX && If_ObjCutBest(pObj)->Delay < ABC_INFINITY);
    }
    // add the trivial cut to the set
    if ( !pObj->fSkipCut && If_ObjCutBest(pObj)->nLeaves > 1 )
    {
        If_ManSetupCutTriv( p, pCutSet->ppCuts[pCutSet->nCuts++], pObj->Id );
        assert( pCutSet->nCuts <= pCutSet->nCutsMax+1 );
    }
//    if ( If_ObjCutBest(pObj)->nLeaves == 0 )
//        p->nBestCutSmall[0]++;
//    else if ( If_ObjCutBest(pObj)->nLeaves == 1 )
//        p->nBestCutSmall[1]++;

    // ref the selected cut
    if ( Mode && pObj->nRefs > 0 )
        If_CutAreaRef( p, If_ObjCutBest(pObj) );
    if ( If_ObjCutBest(pObj)->fUseless )
        Abc_Print( 1, "The best cut is useless.\n" );
    // call the user specified function for each cut
    if ( p->pPars->pFuncUser )
        If_ObjForEachCut( pObj, pCut, i )
            p->pPars->pFuncUser( p, pObj, pCut );
    // free the cuts
    If_ManDerefNodeCutSet( p, pObj );
}